

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_150d466::Toolchains::DumpToolchainVariables
          (Value *__return_storage_ptr__,Toolchains *this,cmMakefile *mf,string *lang,
          vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
          *variables)

{
  ToolchainVariable *pTVar1;
  Value *extraout_RAX;
  Value *pVVar2;
  Value *extraout_RAX_00;
  ToolchainVariable *variable;
  ToolchainVariable *variable_00;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  pTVar1 = (ToolchainVariable *)lang->_M_string_length;
  pVVar2 = extraout_RAX;
  for (variable_00 = (ToolchainVariable *)(lang->_M_dataplus)._M_p; variable_00 != pTVar1;
      variable_00 = variable_00 + 1) {
    DumpToolchainVariable
              (this,(cmMakefile *)__return_storage_ptr__,
               (Value *)(mf->FindPackageRootPathStack).
                        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map,
               (string *)
               (mf->FindPackageRootPathStack).
               super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map_size,variable_00);
    pVVar2 = extraout_RAX_00;
  }
  return pVVar2;
}

Assistant:

Json::Value Toolchains::DumpToolchainVariables(
  cmMakefile const* mf, std::string const& lang,
  std::vector<ToolchainVariable> const& variables)
{
  Json::Value object = Json::objectValue;
  for (const auto& variable : variables) {
    this->DumpToolchainVariable(mf, object, lang, variable);
  }
  return object;
}